

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O0

uint rlLoadVertexBufferElement(void *buffer,int size,_Bool dynamic)

{
  GLenum GVar1;
  GLuint local_1c;
  byte local_15;
  uint id;
  _Bool dynamic_local;
  void *pvStack_10;
  int size_local;
  void *buffer_local;
  
  local_1c = 0;
  local_15 = dynamic;
  id = size;
  pvStack_10 = buffer;
  (*glad_glGenBuffers)(1,&local_1c);
  (*glad_glBindBuffer)(0x8893,local_1c);
  GVar1 = 0x88e4;
  if ((local_15 & 1) != 0) {
    GVar1 = 0x88e8;
  }
  (*glad_glBufferData)(0x8893,(long)(int)id,pvStack_10,GVar1);
  return local_1c;
}

Assistant:

unsigned int rlLoadVertexBufferElement(void *buffer, int size, bool dynamic)
{
    unsigned int id = 0;

#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    glGenBuffers(1, &id);
    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, id);
    glBufferData(GL_ELEMENT_ARRAY_BUFFER, size, buffer, dynamic? GL_DYNAMIC_DRAW : GL_STATIC_DRAW);
#endif

    return id;
}